

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O3

void __thiscall
glcts::ViewportArray::APIErrors::checkGLError
          (APIErrors *this,GLenum expected_error,GLchar *description,bool *out_result)

{
  int iVar1;
  GLenum GVar2;
  undefined4 extraout_var;
  size_t sVar3;
  Enum<int,_2UL> local_1c8;
  Enum<int,_2UL> local_1b8;
  undefined1 local_1a8 [8];
  _func_int **local_1a0;
  ios_base local_130 [264];
  
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  GVar2 = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  if (GVar2 != expected_error) {
    local_1a8 = (undefined1  [8])((this->super_TestCaseBase).m_context)->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0,"Test case fail. Description: ",0x1d);
    if (description == (GLchar *)0x0) {
      std::ios::clear((int)(ostringstream *)&local_1a0 + (int)local_1a0[-3]);
    }
    else {
      sVar3 = strlen(description);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,description,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0," Invalid error: ",0x10);
    local_1b8.m_getName = glu::getErrorName;
    local_1b8.m_value = GVar2;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1b8,(ostream *)&local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0," expected: ",0xb);
    local_1c8.m_getName = glu::getErrorName;
    local_1c8.m_value = expected_error;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c8,(ostream *)&local_1a0);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
    std::ios_base::~ios_base(local_130);
    *out_result = false;
  }
  return;
}

Assistant:

void APIErrors::checkGLError(GLenum expected_error, const GLchar* description, bool& out_result)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	GLenum error = gl.getError();

	if (expected_error != error)
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Test case fail. Description: " << description
											<< " Invalid error: " << glu::getErrorStr(error)
											<< " expected: " << glu::getErrorStr(expected_error)
											<< tcu::TestLog::EndMessage;

		out_result = false;
	}
}